

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::XML_ReadNode_GetVal_AsString(AMFImporter *this,string *pValue)

{
  int iVar1;
  DeadlyImportError *pDVar2;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 == '\0') {
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"XML_ReadNode_GetVal_AsString. No data, seems file is corrupt.",
               &local_39);
    DeadlyImportError::DeadlyImportError(pDVar2,&local_38);
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 3) {
    (*this->mReader->_vptr_IIrrXMLReader[0xe])();
    std::__cxx11::string::assign((char *)pValue);
    return;
  }
  pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "XML_ReadNode_GetVal_AsString. Invalid type of XML element, seems file is corrupt.",
             &local_39);
  DeadlyImportError::DeadlyImportError(pDVar2,&local_38);
  __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::XML_ReadNode_GetVal_AsString(std::string& pValue)
{
	if(!mReader->read()) throw DeadlyImportError("XML_ReadNode_GetVal_AsString. No data, seems file is corrupt.");
	if(mReader->getNodeType() != irr::io::EXN_TEXT)
		throw DeadlyImportError("XML_ReadNode_GetVal_AsString. Invalid type of XML element, seems file is corrupt.");

	pValue = mReader->getNodeData();
}